

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall sjtu::invalid_command::invalid_command(invalid_command *this)

{
  undefined8 *in_RDI;
  exception *in_stack_00000010;
  
  exception::exception(in_stack_00000010);
  *in_RDI = &PTR_what_abi_cxx11__00137880;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"invalid_command");
  return;
}

Assistant:

invalid_command() {
	    wro = "invalid_command";
	}